

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O3

EVP_PKEY * d2i_PUBKEY(EVP_PKEY **a,uchar **pp,long length)

{
  EVP_PKEY *pEVar1;
  CBS cbs;
  CBS local_28;
  
  if (length < 0) {
    pEVar1 = (EVP_PKEY *)0x0;
  }
  else {
    local_28.data = *pp;
    local_28.len = length;
    pEVar1 = (EVP_PKEY *)EVP_parse_public_key(&local_28);
    if (pEVar1 != (EVP_PKEY *)0x0) {
      if (a != (EVP_PKEY **)0x0) {
        EVP_PKEY_free(*a);
        *a = pEVar1;
      }
      *pp = local_28.data;
    }
  }
  return pEVar1;
}

Assistant:

EVP_PKEY *d2i_PUBKEY(EVP_PKEY **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return nullptr;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  bssl::UniquePtr<EVP_PKEY> ret(EVP_parse_public_key(&cbs));
  if (ret == nullptr) {
    return nullptr;
  }
  if (out != nullptr) {
    EVP_PKEY_free(*out);
    *out = ret.get();
  }
  *inp = CBS_data(&cbs);
  return ret.release();
}